

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::write_blank_line(CVmFormatter *this)

{
  long in_RDI;
  vm_nl_type in_stack_0000001c;
  CVmFormatter *in_stack_00000020;
  vm_nl_type in_stack_000000b4;
  vmcon_color_t *in_stack_000000b8;
  size_t in_stack_000000c0;
  wchar_t *in_stack_000000c8;
  CVmFormatter *in_stack_000000d0;
  
  flush(in_stack_00000020,in_stack_0000001c);
  if ((*(ushort *)(in_RDI + 0xef81) >> 6 & 1) != 0) {
    write_text(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
               in_stack_000000b4);
  }
  write_text(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b4);
  return;
}

Assistant:

void CVmFormatter::write_blank_line(VMG0_)
{
    /* flush the stream */
    flush(vmg_ VM_NL_NEWLINE);

    /* if generating for an HTML display target, add an HTML line break */
    if (html_target_)
        write_text(vmg_ L"<BR>", 4, 0, VM_NL_NONE);

    /* write out a blank line */
    write_text(vmg_ L"", 0, 0, VM_NL_NEWLINE);
}